

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_VXR(coda_cdf_product *product_file,coda_cdf_variable *variable,int64_t offset,int32_t first
            ,int32_t last)

{
  int iVar1;
  long local_60;
  int64_t vr_offset;
  int local_50;
  int32_t vr_last;
  int32_t vr_first;
  int i;
  int32_t nused_entries;
  int32_t n_entries;
  int64_t vxr_next;
  int32_t local_30;
  int32_t record_type;
  int32_t last_local;
  int32_t first_local;
  int64_t offset_local;
  coda_cdf_variable *variable_local;
  coda_cdf_product *product_file_local;
  
  if (offset == 0) {
    product_file_local._4_4_ = 0;
  }
  else {
    local_30 = last;
    record_type = first;
    _last_local = offset;
    offset_local = (int64_t)variable;
    variable_local = (coda_cdf_variable *)product_file;
    iVar1 = read_bytes(product_file->raw_product,offset + 8,4,(void *)((long)&vxr_next + 4));
    if (iVar1 < 0) {
      product_file_local._4_4_ = -1;
    }
    else {
      swap4((void *)((long)&vxr_next + 4));
      if (vxr_next._4_4_ == 6) {
        iVar1 = read_bytes((coda_product *)variable_local->data,_last_local + 0xc,8,&nused_entries);
        if (iVar1 < 0) {
          product_file_local._4_4_ = -1;
        }
        else {
          iVar1 = read_bytes((coda_product *)variable_local->data,_last_local + 0x14,4,&i);
          if (iVar1 < 0) {
            product_file_local._4_4_ = -1;
          }
          else {
            iVar1 = read_bytes((coda_product *)variable_local->data,_last_local + 0x18,4,&vr_first);
            if (iVar1 < 0) {
              product_file_local._4_4_ = -1;
            }
            else {
              swap8(&nused_entries);
              swap4(&i);
              swap4(&vr_first);
              _last_local = _last_local + 0x1c;
              if ((_nused_entries < 0) || ((long)variable_local->definition <= _nused_entries)) {
                coda_set_error(-300,"CDF file has invalid offset for VXR record");
                product_file_local._4_4_ = -1;
              }
              else if (i < 0) {
                coda_set_error(-300,"CDF file has invalid number of entries for VXR record");
                product_file_local._4_4_ = -1;
              }
              else {
                for (vr_last = 0; vr_last < vr_first; vr_last = vr_last + 1) {
                  iVar1 = read_bytes((coda_product *)variable_local->data,
                                     _last_local + (vr_last << 2),4,&local_50);
                  if (iVar1 < 0) {
                    return -1;
                  }
                  iVar1 = read_bytes((coda_product *)variable_local->data,
                                     _last_local + (vr_last + i) * 4,4,
                                     (void *)((long)&vr_offset + 4));
                  if (iVar1 < 0) {
                    return -1;
                  }
                  iVar1 = read_bytes((coda_product *)variable_local->data,
                                     _last_local + (vr_last + i) * 8,8,&local_60);
                  if (iVar1 < 0) {
                    return -1;
                  }
                  swap4(&local_50);
                  swap4((void *)((long)&vr_offset + 4));
                  swap8(&local_60);
                  if (local_50 < 0) {
                    coda_set_error(-300,"CDF file has invalid first record number in VXR record");
                    return -1;
                  }
                  if (vr_offset._4_4_ < 0) {
                    coda_set_error(-300,"CDF file has invalid last record number in VXR record");
                    return -1;
                  }
                  if ((local_60 < 0) || ((long)variable_local->definition <= local_60)) {
                    coda_set_error(-300,"CDF file has invalid offset for VR record");
                    return -1;
                  }
                  iVar1 = read_VR((coda_cdf_product *)variable_local,
                                  (coda_cdf_variable *)offset_local,local_60,local_50,
                                  vr_offset._4_4_);
                  if (iVar1 != 0) {
                    return -1;
                  }
                }
                iVar1 = read_VXR((coda_cdf_product *)variable_local,
                                 (coda_cdf_variable *)offset_local,_nused_entries,record_type,
                                 local_30);
                if (iVar1 == 0) {
                  product_file_local._4_4_ = 0;
                }
                else {
                  product_file_local._4_4_ = -1;
                }
              }
            }
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for VXR record",
                       (ulong)vxr_next._4_4_);
        product_file_local._4_4_ = -1;
      }
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_VXR(coda_cdf_product *product_file, coda_cdf_variable *variable, int64_t offset, int32_t first,
                    int32_t last)
{
    int32_t record_type;
    int64_t vxr_next;
    int32_t n_entries;
    int32_t nused_entries;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 6)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for VXR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vxr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &n_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &nused_entries) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&vxr_next);
    swap_int32(&n_entries);
    swap_int32(&nused_entries);
#endif
    offset += 28;
    if (vxr_next < 0 || vxr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (n_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries for VXR record");
        return -1;
    }

    for (i = 0; i < nused_entries; i++)
    {
        int32_t vr_first;
        int32_t vr_last;
        int64_t vr_offset;

        if (read_bytes(product_file->raw_product, offset + i * 4, 4, &vr_first) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 4, 4, &vr_last) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 8, 8, &vr_offset) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&vr_first);
        swap_int32(&vr_last);
        swap_int64(&vr_offset);
#endif
        if (vr_first < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid first record number in VXR record");
            return -1;
        }
        if (vr_last < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid last record number in VXR record");
            return -1;
        }
        if (vr_offset < 0 || vr_offset >= product_file->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VR record");
            return -1;
        }
        if (read_VR(product_file, variable, vr_offset, vr_first, vr_last) != 0)
        {
            return -1;
        }
    }

    if (read_VXR(product_file, variable, vxr_next, first, last) != 0)
    {
        return -1;
    }

    return 0;
}